

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SuccessAfterDecorator.hpp
# Opt level: O3

Status __thiscall
AO::BehaviorTree::Version_1::Details::SuccessAfterDecorator<Agent,_short>::filter
          (SuccessAfterDecorator<Agent,_short> *this,EntityPtr entity,short args)

{
  pointer psVar1;
  element_type *peVar2;
  RootNode<Agent,_short> *pRVar3;
  Status SVar4;
  Status SVar5;
  int iVar6;
  
  if (this->count == 0) {
    psVar1 = (this->super_DecoratorNode<Agent,_short>).super_CompositeNode<Agent,_short>.children.
             super__Vector_base<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_std::allocator<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (psVar1 == (this->super_DecoratorNode<Agent,_short>).super_CompositeNode<Agent,_short>.
                  children.
                  super__Vector_base<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_std::allocator<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      return Success;
    }
    peVar2 = (psVar1->
             super___shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr;
    iVar6 = (*(peVar2->super_RootNode<Agent,_short>)._vptr_RootNode[3])
                      (peVar2,entity,(ulong)(uint)(int)args);
    SVar4 = Success;
    SVar5 = (Status)iVar6;
  }
  else {
    this->count = this->count - 1;
    psVar1 = (this->super_DecoratorNode<Agent,_short>).super_CompositeNode<Agent,_short>.children.
             super__Vector_base<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_std::allocator<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (psVar1 == (this->super_DecoratorNode<Agent,_short>).super_CompositeNode<Agent,_short>.
                  children.
                  super__Vector_base<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_std::allocator<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      return Running;
    }
    peVar2 = (psVar1->
             super___shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr;
    iVar6 = (*(peVar2->super_RootNode<Agent,_short>)._vptr_RootNode[3])
                      (peVar2,entity,(ulong)(uint)(int)args);
    SVar4 = (Status)iVar6;
    SVar5 = SVar4;
  }
  if (SVar5 < Running) {
    pRVar3 = &((((this->super_DecoratorNode<Agent,_short>).super_CompositeNode<Agent,_short>.
                 children.
                 super__Vector_base<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_std::allocator<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super___shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr)->super_RootNode<Agent,_short>;
    (**(code **)((long)pRVar3->_vptr_RootNode + 0x10))(pRVar3,entity);
  }
  return SVar4;
}

Assistant:

Status filter(EntityPtr entity, Args... args) override final
					{
						if (count == 0)
						{
							if (!this->children.empty())
							{
								Status const status = this->children.front()->execute(entity, args...);
								if (status == Status::Success || status == Status::Failure)
								{
									this->children.front()->initialize(entity);
								}
							}
							return Status::Success;
						}
						else
						{
							--count;
							if (!this->children.empty())
							{
								Status const status = this->children.front()->execute(entity, args...);
								if (status == Status::Success || status == Status::Failure)
								{
									this->children.front()->initialize(entity);
								}
								return status;
							}
							return Status::Running;
						}
					}